

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_countBackwardsMatch_2segments
                 (BYTE *pIn,BYTE *pAnchor,BYTE *pMatch,BYTE *pMatchBase,BYTE *pExtDictStart,
                 BYTE *pExtDictEnd)

{
  size_t sVar1;
  size_t matchLength;
  BYTE *pExtDictEnd_local;
  BYTE *pExtDictStart_local;
  BYTE *pMatchBase_local;
  BYTE *pMatch_local;
  BYTE *pAnchor_local;
  BYTE *pIn_local;
  
  pIn_local = (BYTE *)ZSTD_ldm_countBackwardsMatch(pIn,pAnchor,pMatch,pMatchBase);
  if ((pMatch + -(long)pIn_local == pMatchBase) && (pMatchBase != pExtDictStart)) {
    sVar1 = ZSTD_ldm_countBackwardsMatch(pIn + -(long)pIn_local,pAnchor,pExtDictEnd,pExtDictStart);
    pIn_local = pIn_local + sVar1;
  }
  return (size_t)pIn_local;
}

Assistant:

static size_t ZSTD_ldm_countBackwardsMatch_2segments(
                    const BYTE* pIn, const BYTE* pAnchor,
                    const BYTE* pMatch, const BYTE* pMatchBase,
                    const BYTE* pExtDictStart, const BYTE* pExtDictEnd)
{
    size_t matchLength = ZSTD_ldm_countBackwardsMatch(pIn, pAnchor, pMatch, pMatchBase);
    if (pMatch - matchLength != pMatchBase || pMatchBase == pExtDictStart) {
        /* If backwards match is entirely in the extDict or prefix, immediately return */
        return matchLength;
    }
    DEBUGLOG(7, "ZSTD_ldm_countBackwardsMatch_2segments: found 2-parts backwards match (length in prefix==%zu)", matchLength);
    matchLength += ZSTD_ldm_countBackwardsMatch(pIn - matchLength, pAnchor, pExtDictEnd, pExtDictStart);
    DEBUGLOG(7, "final backwards match length = %zu", matchLength);
    return matchLength;
}